

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

Block * __thiscall
wasm::I64ToI32Lowering::lowerShift
          (I64ToI32Lowering *this,BinaryOp op,Block *result,TempVar *leftLow,TempVar *leftHigh,
          TempVar *rightLow,TempVar *rightHigh)

{
  Index IVar1;
  Builder *pBVar2;
  Builder *pBVar3;
  undefined4 uVar4;
  Expression *pEVar5;
  Const *pCVar6;
  Binary *pBVar7;
  Const *pCVar8;
  Binary *pBVar9;
  Block *pBVar10;
  Block *pBVar11;
  If *this_00;
  int iVar12;
  undefined4 in_register_00000034;
  ulong uVar13;
  optional<wasm::Type> type_;
  Block *local_a0;
  Block *local_98;
  LocalSet *local_90;
  Binary *local_88;
  Const *local_80;
  undefined8 local_78;
  TempVar *local_70;
  undefined1 local_68 [8];
  TempVar shift;
  
  local_78 = CONCAT44(in_register_00000034,op);
  local_70 = leftHigh;
  shift.ty.id = (uintptr_t)leftLow;
  if (2 < op - ShlInt64) {
    __assert_fail("op == ShlInt64 || op == ShrUInt64 || op == ShrSInt64",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                  ,0x4bc,
                  "Block *wasm::I64ToI32Lowering::lowerShift(BinaryOp, Block *, TempVar &&, TempVar &&, TempVar &&, TempVar &&)"
                 );
  }
  getTemp((TempVar *)local_68,this,(Type)0x2);
  uVar4 = local_68._0_4_;
  if (((char)shift.pass != '\x01') && (local_98 = result, rightLow->moved != true)) {
    pBVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar1 = rightLow->idx;
    pEVar5 = (Expression *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x18,8);
    pEVar5->_id = LocalGetId;
    *(Index *)(pEVar5 + 1) = IVar1;
    (pEVar5->type).id = 2;
    pCVar6 = Builder::makeConst<int>
                       ((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0x1f);
    pBVar7 = (Binary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x28,8);
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar7->op = AndInt32;
    pBVar7->left = pEVar5;
    pBVar7->right = (Expression *)pCVar6;
    Binary::finalize(pBVar7);
    local_90 = Builder::makeLocalSet(pBVar2,uVar4,(Expression *)pBVar7);
    pBVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    pCVar6 = Builder::makeConst<int>(pBVar2,0x20);
    if (rightLow->moved == true) goto LAB_008e8630;
    pBVar3 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar1 = rightLow->idx;
    pEVar5 = (Expression *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x18,8);
    pEVar5->_id = LocalGetId;
    *(Index *)(pEVar5 + 1) = IVar1;
    (pEVar5->type).id = 2;
    pCVar8 = Builder::makeConst<int>
                       ((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0x3f);
    pBVar7 = (Binary *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x28,8);
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar7->op = AndInt32;
    pBVar7->left = pEVar5;
    pBVar7->right = (Expression *)pCVar8;
    Binary::finalize(pBVar7);
    pBVar9 = (Binary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x28,8);
    (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar9->op = LeUInt32;
    pBVar9->left = (Expression *)pCVar6;
    pBVar9->right = (Expression *)pBVar7;
    Binary::finalize(pBVar9);
    iVar12 = (int)local_78;
    local_88 = pBVar9;
    if (iVar12 == 0x23) {
      if (((rightHigh->moved == true) || (*(char *)(shift.ty.id + 0x10) == '\x01')) ||
         ((char)shift.pass == '\x01')) goto LAB_008e8630;
      pBVar10 = makeLargeShl(this,rightHigh->idx,*(Index *)shift.ty.id,local_68._0_4_);
    }
    else if (iVar12 == 0x24) {
      if (((rightHigh->moved == true) || (local_70->moved == true)) || ((char)shift.pass == '\x01'))
      goto LAB_008e8630;
      pBVar10 = makeLargeShrS(this,rightHigh->idx,local_70->idx,local_68._0_4_);
    }
    else {
      if (iVar12 != 0x25) goto LAB_008e866e;
      if (((rightHigh->moved == true) || (local_70->moved == true)) || ((char)shift.pass == '\x01'))
      goto LAB_008e8630;
      pBVar10 = makeLargeShrU(this,rightHigh->idx,local_70->idx,local_68._0_4_);
    }
    pBVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    pCVar6 = Builder::makeConst<int>(pBVar2,1);
    uVar4 = local_68._0_4_;
    if ((char)shift.pass != '\x01') {
      pEVar5 = (Expression *)
               MixedArena::allocSpace
                         (&((this->builder)._M_t.
                            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                            .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                           allocator,0x18,8);
      pEVar5->_id = LocalGetId;
      *(undefined4 *)(pEVar5 + 1) = uVar4;
      (pEVar5->type).id = 2;
      pBVar7 = (Binary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x28,8);
      (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar7->op = ShlInt32;
      pBVar7->left = (Expression *)pCVar6;
      pBVar7->right = pEVar5;
      Binary::finalize(pBVar7);
      pCVar6 = Builder::makeConst<int>
                         ((this->builder)._M_t.
                          super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                          .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,1);
      pBVar9 = (Binary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x28,8);
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar9->op = SubInt32;
      pBVar9->left = (Expression *)pBVar7;
      pBVar9->right = (Expression *)pCVar6;
      Binary::finalize(pBVar9);
      pBVar2 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      local_80 = Builder::makeConst<int>(pBVar2,0x20);
      uVar4 = local_68._0_4_;
      if ((char)shift.pass != '\x01') {
        pEVar5 = (Expression *)
                 MixedArena::allocSpace
                           (&((this->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                             allocator,0x18,8);
        pEVar5->_id = LocalGetId;
        *(undefined4 *)(pEVar5 + 1) = uVar4;
        (pEVar5->type).id = 2;
        pBVar7 = (Binary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x28,8);
        (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId
        ;
        (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar7->op = SubInt32;
        pBVar7->left = (Expression *)local_80;
        pBVar7->right = pEVar5;
        Binary::finalize(pBVar7);
        iVar12 = (int)local_78;
        if (iVar12 == 0x23) {
          if ((((rightHigh->moved == true) || (*(char *)(shift.ty.id + 0x10) == '\x01')) ||
              (local_70->moved == true)) || ((char)shift.pass == '\x01')) goto LAB_008e8630;
          pBVar11 = makeSmallShl(this,rightHigh->idx,*(Index *)shift.ty.id,local_70->idx,
                                 local_68._0_4_,pBVar9,pBVar7);
        }
        else if (iVar12 == 0x24) {
          if (((rightHigh->moved == true) || (*(char *)(shift.ty.id + 0x10) == '\x01')) ||
             ((local_70->moved == true || ((char)shift.pass == '\x01')))) goto LAB_008e8630;
          pBVar11 = makeSmallShrS(this,rightHigh->idx,*(Index *)shift.ty.id,local_70->idx,
                                  local_68._0_4_,pBVar9,pBVar7);
        }
        else {
          if (iVar12 != 0x25) {
LAB_008e866e:
            abort();
          }
          if (((rightHigh->moved == true) || (*(char *)(shift.ty.id + 0x10) == '\x01')) ||
             ((local_70->moved == true || ((char)shift.pass == '\x01')))) goto LAB_008e8630;
          pBVar11 = makeSmallShrU(this,rightHigh->idx,*(Index *)shift.ty.id,local_70->idx,
                                  local_68._0_4_,pBVar9,pBVar7);
        }
        uVar13 = 0x28;
        this_00 = (If *)MixedArena::allocSpace
                                  (&((this->builder)._M_t.
                                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                     .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->
                                    wasm->allocator,0x28,8);
        (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
        (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
        this_00->condition = (Expression *)local_88;
        this_00->ifTrue = (Expression *)pBVar10;
        this_00->ifFalse = (Expression *)pBVar11;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar13;
        If::finalize(this_00,type_);
        pBVar2 = (this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        pBVar10 = Builder::blockify(pBVar2,(Expression *)local_98,(Expression *)local_90);
        pBVar10 = Builder::blockify(pBVar2,(Expression *)pBVar10,(Expression *)this_00);
        local_a0 = pBVar10;
        std::
        _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                  ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->highBitVars,&local_a0,rightHigh);
        TempVar::~TempVar((TempVar *)local_68);
        return pBVar10;
      }
    }
  }
LAB_008e8630:
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

Block* lowerShift(BinaryOp op,
                    Block* result,
                    TempVar&& leftLow,
                    TempVar&& leftHigh,
                    TempVar&& rightLow,
                    TempVar&& rightHigh) {
    assert(op == ShlInt64 || op == ShrUInt64 || op == ShrSInt64);
    // shift left lowered as:
    // if 32 <= rightLow % 64:
    //     high = leftLow << k; low = 0
    // else:
    //     high = (((1 << k) - 1) & (leftLow >> (32 - k))) | (leftHigh << k);
    //     low = leftLow << k
    // where k = shift % 32. shift right is similar.
    TempVar shift = getTemp();
    LocalSet* setShift = builder->makeLocalSet(
      shift,
      builder->makeBinary(AndInt32,
                          builder->makeLocalGet(rightLow, Type::i32),
                          builder->makeConst(int32_t(32 - 1))));
    Binary* isLargeShift = builder->makeBinary(
      LeUInt32,
      builder->makeConst(int32_t(32)),
      builder->makeBinary(AndInt32,
                          builder->makeLocalGet(rightLow, Type::i32),
                          builder->makeConst(int32_t(64 - 1))));
    Block* largeShiftBlock;
    switch (op) {
      case ShlInt64:
        largeShiftBlock = makeLargeShl(rightHigh, leftLow, shift);
        break;
      case ShrSInt64:
        largeShiftBlock = makeLargeShrS(rightHigh, leftHigh, shift);
        break;
      case ShrUInt64:
        largeShiftBlock = makeLargeShrU(rightHigh, leftHigh, shift);
        break;
      default:
        abort();
    }
    Binary* shiftMask = builder->makeBinary(
      SubInt32,
      builder->makeBinary(ShlInt32,
                          builder->makeConst(int32_t(1)),
                          builder->makeLocalGet(shift, Type::i32)),
      builder->makeConst(int32_t(1)));
    Binary* widthLessShift =
      builder->makeBinary(SubInt32,
                          builder->makeConst(int32_t(32)),
                          builder->makeLocalGet(shift, Type::i32));
    Block* smallShiftBlock;
    switch (op) {
      case ShlInt64: {
        smallShiftBlock = makeSmallShl(
          rightHigh, leftLow, leftHigh, shift, shiftMask, widthLessShift);
        break;
      }
      case ShrSInt64: {
        smallShiftBlock = makeSmallShrS(
          rightHigh, leftLow, leftHigh, shift, shiftMask, widthLessShift);
        break;
      }
      case ShrUInt64: {
        smallShiftBlock = makeSmallShrU(
          rightHigh, leftLow, leftHigh, shift, shiftMask, widthLessShift);
        break;
      }
      default:
        abort();
    }
    If* ifLargeShift =
      builder->makeIf(isLargeShift, largeShiftBlock, smallShiftBlock);
    result = builder->blockify(result, setShift, ifLargeShift);
    setOutParam(result, std::move(rightHigh));
    return result;
  }